

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O3

int reserve_buf(nghttp3_buf *buf,size_t extra_size,nghttp3_mem *mem)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar3 = nghttp3_buf_left(buf);
  iVar2 = 0;
  if (sVar3 <= extra_size && extra_size - sVar3 != 0) {
    sVar4 = nghttp3_buf_cap(buf);
    uVar5 = (extra_size - sVar3) + sVar4;
    iVar2 = -0x385;
    if (uVar5 < 0x80000001) {
      iVar2 = 0x20;
      if (0x20 < uVar5) {
        iVar2 = (int)uVar5;
      }
      iVar1 = 0x1f;
      if (iVar2 - 1U != 0) {
        for (; iVar2 - 1U >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      iVar2 = nghttp3_buf_reserve(buf,(ulong)(uint)(1 << (-((byte)iVar1 ^ 0x1f) & 0x1f)),mem);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

static int reserve_buf(nghttp3_buf *buf, size_t extra_size,
                       const nghttp3_mem *mem) {
  size_t left = nghttp3_buf_left(buf);
  size_t n = 32;

  if (left >= extra_size) {
    return 0;
  }

  n = nghttp3_max_size(n, nghttp3_buf_cap(buf) + extra_size - left);

  /* Check whether we are requesting too much memory */
  if (n > (1u << 31)) {
    return NGHTTP3_ERR_NOMEM;
  }

#ifndef WIN32
  n = 1u << (32 - __builtin_clz((uint32_t)n - 1));
#else  /* defined(WIN32) */
  /* Round up to the next highest power of 2 from Bit Twiddling
     Hacks */
  --n;
  n |= n >> 1;
  n |= n >> 2;
  n |= n >> 4;
  n |= n >> 8;
  n |= n >> 16;
  ++n;
#endif /* defined(WIN32) */

  return nghttp3_buf_reserve(buf, n, mem);
}